

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFopen.c
# Opt level: O0

void NFopen_worker(void *a,ProxyRecord *records)

{
  Elf64_Addr EVar1;
  NF_link_map *pNVar2;
  NF_list *late;
  void *pvStack_50;
  int tmp_mode;
  Elf64_Addr next_addr;
  NF_list *tmp;
  NF_link_map *new;
  void *addr;
  int mode;
  char *file;
  NFopen_args *args;
  ProxyRecord *records_local;
  void *a_local;
  
  if (head == (NF_list *)0x0) {
    printf("Fatal error: NFusage not called before NFopen!\n");
    exit(1);
  }
  pNVar2 = NF_map(head,*(int *)((long)a + 8),*(void **)((long)a + 0x10));
  *(NF_link_map **)((long)a + 0x18) = pNVar2;
  pvStack_50 = (void *)(pNVar2->l_addr + head->len);
  for (next_addr = (Elf64_Addr)head->next; next_addr != 0;
      next_addr = *(Elf64_Addr *)(next_addr + 8)) {
    NF_map((NF_list *)next_addr,late._4_4_,pvStack_50);
    pvStack_50 = (void *)(*(long *)(next_addr + 0x18) + (long)pvStack_50);
  }
  next_addr = (Elf64_Addr)head;
  head->map->l_prev = (NF_link_map *)0x0;
  for (; next_addr != 0; next_addr = *(Elf64_Addr *)(next_addr + 8)) {
    NFreloc(*(NF_link_map **)next_addr,records);
    if (*(long *)(next_addr + 8) == 0) {
      *(undefined8 *)(*(long *)next_addr + 0x20) = 0;
    }
    else {
      *(undefined8 *)(*(long *)next_addr + 0x20) = **(undefined8 **)(next_addr + 8);
      *(undefined8 *)(**(long **)(next_addr + 8) + 0x18) = *(undefined8 *)next_addr;
    }
  }
  next_addr = (Elf64_Addr)head;
  while (next_addr != 0) {
    close(*(int *)(next_addr + 0x14));
    EVar1 = *(Elf64_Addr *)(next_addr + 8);
    free((void *)next_addr);
    next_addr = EVar1;
  }
  return;
}

Assistant:

static void NFopen_worker(void *a, const ProxyRecord *records)
{
    struct NFopen_args *args = a;
    const char *file = args->file;
    int mode  = args->mode;
    void *addr = args->addr;

    if(head == NULL)
    {
        printf("Fatal error: NFusage not called before NFopen!\n");
        //maybe directly exit here?
        exit(1);
    }
    /* search and load and map, space is allocated here on heap */
    struct NF_link_map *new = NF_map(head, mode, addr);
    args->new = new;

    /* the mapping of dependencies is now controled by the list, so no need for map_deps */
    struct NF_list *tmp = head->next;
    Elf64_Addr next_addr = (Elf64_Addr) new->l_addr + head->len; //use l_addr instead of addr in case of 0

    while(tmp)
    {
        //add interactive querying for address here
        int tmp_mode;
        //printf("shared library:%s needs an open mode:", tmp->map->l_name);
        //scanf("%d", &tmp_mode);
        //Elf64_Addr tmp_addr = 0x0;
        //NF_map(tmp, tmp_mode, (void *)tmp_addr);
        NF_map(tmp, tmp_mode, (void *) next_addr);
        next_addr += tmp->len;
        
        tmp = tmp->next;
    }

    /* filling in dependency info, like search list */
    //map_deps(new);

    /* relocating */
    /* I don't think a relocation is needed when so access its internal funcs and vars
     * Using l_addr + their offset at ELF will resolve it, because we are dynamically loading
     * we don't even need to know the address of the symbols until a explicit NFsym is called
     * Upon call, NFsym check match the dynamic symbol table, and return an address
     * 
     * But external symbols certainly need relocation, for we don't know the address of other so at runtime
     * The dynamic loader would probably do the job: go through all the link map, find the dependency, and use the base address
     * of the dep as the l_addr of that symbol. In this case the main program may exist as a link map
     * because of the --rdynamic option at linking
     * In this case, we need to traverse the link_map like ld.so, and update the GOT
     * It would make a difference whether the deps are mapped as an NF or not, in which case we check both link(only 2!)
     * 
     * After all, I'm doing a dynamic loading, and don't need the symbols to be all settled when I enter the program
     */
    tmp = head;
    tmp->map->l_prev = NULL;
    while(tmp)
    {
        NFreloc(tmp->map, records);
        if(tmp->next)
        {
            tmp->map->l_next = tmp->next->map;
            tmp->next->map->l_prev = tmp->map;
        }
        else
        {
            tmp->map->l_next = NULL;
        }
        
        tmp = tmp->next;
    }

    /* destroy the list */
    tmp = head;
    struct NF_list *late;
    while (tmp)
    {
        close(tmp ->fd);
        late = tmp;
        tmp = tmp->next;
        free(late);
    }
    
    //NFreloc(new);
}